

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeExplain(Parse *pParse,u8 bPush,char *zFmt,...)

{
  int p1;
  Vdbe *p;
  char in_AL;
  int addr;
  char *zP4;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_f8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (pParse->explain == '\x02') {
    local_f8.reg_save_area = local_d8;
    local_f8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_f8.gp_offset = 0x18;
    local_f8.fp_offset = 0x30;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    zP4 = sqlite3VMPrintf(pParse->db,zFmt,&local_f8);
    p = pParse->pVdbe;
    p1 = p->nOp;
    addr = sqlite3VdbeAddOp3(p,0xab,p1,pParse->addrExplain,0);
    sqlite3VdbeChangeP4(p,addr,zP4,-7);
    if (bPush != '\0') {
      pParse->addrExplain = p1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeExplain(Parse *pParse, u8 bPush, const char *zFmt, ...){
#ifndef SQLITE_DEBUG
  /* Always include the OP_Explain opcodes if SQLITE_DEBUG is defined.
  ** But omit them (for performance) during production builds */
  if( pParse->explain==2 )
#endif
  {
    char *zMsg;
    Vdbe *v;
    va_list ap;
    int iThis;
    va_start(ap, zFmt);
    zMsg = sqlite3VMPrintf(pParse->db, zFmt, ap);
    va_end(ap);
    v = pParse->pVdbe;
    iThis = v->nOp;
    sqlite3VdbeAddOp4(v, OP_Explain, iThis, pParse->addrExplain, 0,
                      zMsg, P4_DYNAMIC);
    sqlite3ExplainBreakpoint(bPush?"PUSH":"", sqlite3VdbeGetOp(v,-1)->p4.z);
    if( bPush){
      pParse->addrExplain = iThis;
    }
  }
}